

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# snapshot.cpp
# Opt level: O2

void __thiscall CSnapshotBuilder::Init(CSnapshotBuilder *this,CSnapshot *pSnapshot)

{
  int iVar1;
  long lVar2;
  
  iVar1 = pSnapshot->m_NumItems;
  lVar2 = (long)iVar1;
  if ((lVar2 < 0x401) && ((long)pSnapshot->m_DataSize + lVar2 * 8 + 8U < 0x10001)) {
    this->m_DataSize = pSnapshot->m_DataSize;
    this->m_NumItems = iVar1;
    mem_copy(this->m_aOffsets,&pSnapshot[1].m_DataSize + lVar2,iVar1 * 4);
    mem_copy(this,pSnapshot + (long)pSnapshot->m_NumItems + 1,this->m_DataSize);
    return;
  }
  dbg_assert_imp("/workspace/llm4binary/github/license_all_cmakelists_1510/TsFreddie[P]teeworlds/src/engine/shared/snapshot.cpp"
                 ,0x21b,(uint)((long)this->m_DataSize + (long)this->m_NumItems * 8 + 8U < 0x10000),
                 "too much data");
  dbg_assert_imp("/workspace/llm4binary/github/license_all_cmakelists_1510/TsFreddie[P]teeworlds/src/engine/shared/snapshot.cpp"
                 ,0x21c,(uint)(this->m_NumItems < 0x400),"too many items");
  dbg_msg("snapshot","invalid snapshot");
  this->m_DataSize = 0;
  this->m_NumItems = 0;
  return;
}

Assistant:

void CSnapshotBuilder::Init(const CSnapshot *pSnapshot)
{
	if(pSnapshot->m_DataSize + sizeof(CSnapshot) + pSnapshot->m_NumItems * sizeof(int)*2 > CSnapshot::MAX_SIZE || pSnapshot->m_NumItems > MAX_ITEMS)
	{
		// key and offset per item
		dbg_assert(m_DataSize + sizeof(CSnapshot) + m_NumItems * sizeof(int)*2 < CSnapshot::MAX_SIZE, "too much data");
		dbg_assert(m_NumItems < MAX_ITEMS, "too many items");
		dbg_msg("snapshot", "invalid snapshot"); // remove me
		m_DataSize = 0;
		m_NumItems = 0;
		return;
	}

	m_DataSize = pSnapshot->m_DataSize;
	m_NumItems = pSnapshot->m_NumItems;
	mem_copy(m_aOffsets, pSnapshot->Offsets(), sizeof(int)*m_NumItems);
	mem_copy(m_aData, pSnapshot->DataStart(), m_DataSize);
}